

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testLoadUnstructured.hpp
# Opt level: O0

void testExactL2<makeTests(TasGrid::TypeAcceleration,int)::__16>(TasmanianSparseGrid *grid)

{
  allocator<double> *this;
  double dVar1;
  initializer_list<double> __l;
  initializer_list<double> __l_00;
  byte bVar2;
  TypeOneDRule TVar3;
  ostream *poVar4;
  runtime_error *this_00;
  function<void_(const_double_*,_double_*,_unsigned_long)> local_198;
  undefined1 local_170 [8];
  pair<std::vector<double,_std::allocator<double>_>,_std::vector<double,_std::allocator<double>_>_>
  data;
  TasmanianSparseGrid ref_grid;
  double local_b8 [4];
  iterator local_98;
  size_type local_90;
  vector<double,_std::allocator<double>_> local_88;
  allocator<double> local_59;
  double local_58 [3];
  iterator local_40;
  size_type local_38;
  vector<double,_std::allocator<double>_> local_30;
  TasmanianSparseGrid *local_18;
  TasmanianSparseGrid *grid_local;
  
  local_58[2] = -0.5;
  local_58[0] = -0.5;
  local_58[1] = -0.5;
  local_40 = local_58;
  local_38 = 3;
  local_18 = grid;
  std::allocator<double>::allocator(&local_59);
  __l_00._M_len = local_38;
  __l_00._M_array = local_40;
  std::vector<double,_std::allocator<double>_>::vector(&local_30,__l_00,&local_59);
  local_b8[0] = 0.7;
  local_b8[1] = 0.7;
  local_b8[2] = 0.7;
  local_98 = local_b8;
  local_90 = 3;
  this = (allocator<double> *)
         ((long)&ref_grid.acc_domain._M_t.
                 super___uniq_ptr_impl<TasGrid::AccelerationDomainTransform,_std::default_delete<TasGrid::AccelerationDomainTransform>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_TasGrid::AccelerationDomainTransform_*,_std::default_delete<TasGrid::AccelerationDomainTransform>_>
                 .super__Head_base<0UL,_TasGrid::AccelerationDomainTransform_*,_false> + 7);
  std::allocator<double>::allocator(this);
  __l._M_len = local_90;
  __l._M_array = local_98;
  std::vector<double,_std::allocator<double>_>::vector(&local_88,__l,this);
  TasGrid::TasmanianSparseGrid::setDomainTransform((vector *)grid,(vector *)&local_30);
  std::vector<double,_std::allocator<double>_>::~vector(&local_88);
  std::allocator<double>::~allocator
            ((allocator<double> *)
             ((long)&ref_grid.acc_domain._M_t.
                     super___uniq_ptr_impl<TasGrid::AccelerationDomainTransform,_std::default_delete<TasGrid::AccelerationDomainTransform>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_TasGrid::AccelerationDomainTransform_*,_std::default_delete<TasGrid::AccelerationDomainTransform>_>
                     .super__Head_base<0UL,_TasGrid::AccelerationDomainTransform_*,_false> + 7));
  std::vector<double,_std::allocator<double>_>::~vector(&local_30);
  std::allocator<double>::~allocator(&local_59);
  TasGrid::TasmanianSparseGrid::TasmanianSparseGrid
            ((TasmanianSparseGrid *)
             &data.second.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,local_18);
  generateExactData<makeTests(TasGrid::TypeAcceleration,int)::__16>(local_170,local_18);
  std::function<void(double_const*,double*,unsigned_long)>::
  function<makeTests(TasGrid::TypeAcceleration,int)::__16&,void>
            ((function<void(double_const*,double*,unsigned_long)> *)&local_198,
             (anon_class_1_0_00000001 *)((long)&grid_local + 7));
  TasGrid::loadNeededPoints<true,false>
            (&local_198,
             (TasmanianSparseGrid *)
             &data.second.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,1);
  std::function<void_(const_double_*,_double_*,_unsigned_long)>::~function(&local_198);
  TVar3 = TasGrid::TasmanianSparseGrid::getRule();
  bVar2 = TasGrid::OneDimensionalMeta::isNonNested(TVar3);
  if ((bVar2 & 1) == 0) {
    TasGrid::loadUnstructuredDataL2
              ((vector<double,_std::allocator<double>_> *)local_170,
               (vector<double,_std::allocator<double>_> *)
               &data.first.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,0.0,local_18);
  }
  else {
    TasGrid::loadUnstructuredDataL2
              ((vector<double,_std::allocator<double>_> *)local_170,
               (vector<double,_std::allocator<double>_> *)
               &data.first.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,0.001,local_18);
  }
  TVar3 = TasGrid::TasmanianSparseGrid::getRule();
  bVar2 = TasGrid::OneDimensionalMeta::isNonNested(TVar3);
  if (((bVar2 & 1) != 0) ||
     (dVar1 = coefficientDifference
                        ((TasmanianSparseGrid *)
                         &data.second.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage,local_18), dVar1 <= 1e-12)) {
    TVar3 = TasGrid::TasmanianSparseGrid::getRule();
    bVar2 = TasGrid::OneDimensionalMeta::isNonNested(TVar3);
    if (((bVar2 & 1) == 0) ||
       (dVar1 = evalDifference((vector<double,_std::allocator<double>_> *)local_170,
                               (TasmanianSparseGrid *)
                               &data.second.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage,local_18),
       dVar1 <= 0.01)) {
      std::
      pair<std::vector<double,_std::allocator<double>_>,_std::vector<double,_std::allocator<double>_>_>
      ::~pair((pair<std::vector<double,_std::allocator<double>_>,_std::vector<double,_std::allocator<double>_>_>
               *)local_170);
      TasGrid::TasmanianSparseGrid::~TasmanianSparseGrid
                ((TasmanianSparseGrid *)
                 &data.second.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      return;
    }
  }
  std::operator<<((ostream *)&std::cout,"Failed exact unstructured construction\n");
  poVar4 = std::operator<<((ostream *)&std::cout,"Observed coefficients error: ");
  dVar1 = coefficientDifference
                    ((TasmanianSparseGrid *)
                     &data.second.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,local_18);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,dVar1);
  std::operator<<(poVar4,"\n");
  poVar4 = std::operator<<((ostream *)&std::cout,"Observed evaluate error: ");
  dVar1 = evalDifference((vector<double,_std::allocator<double>_> *)local_170,
                         (TasmanianSparseGrid *)
                         &data.second.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage,local_18);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,dVar1);
  std::operator<<(poVar4,"\n");
  TasGrid::TasmanianSparseGrid::printStats((ostream *)local_18);
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"test failed");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void testExactL2(TasmanianSparseGrid &&grid, CallableModel model){
    grid.setDomainTransform({-0.5, -0.5, -0.5,}, {0.7, 0.7, 0.7});
    auto ref_grid = grid;

    auto data = generateExactData(grid, model);

    loadNeededPoints(model, ref_grid, 1);
    if (OneDimensionalMeta::isNonNested(grid.getRule()))
        loadUnstructuredDataL2(data.first, data.second, 1.E-3, grid);
    else
        loadUnstructuredDataL2(data.first, data.second, 0.0, grid);

    if ((not OneDimensionalMeta::isNonNested(grid.getRule()) and coefficientDifference(ref_grid, grid) > Maths::num_tol)
        or (OneDimensionalMeta::isNonNested(grid.getRule()) and evalDifference(data.first, ref_grid, grid) > 1.E-2))
    {
        cout << "Failed exact unstructured construction\n";
        cout << "Observed coefficients error: " << coefficientDifference(ref_grid, grid) << "\n";
        cout << "Observed evaluate error: " << evalDifference(data.first, ref_grid, grid) << "\n";
        grid.printStats();
        throw std::runtime_error("test failed");
    }
}